

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O2

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::update(ExponentiallyDecayingReservoir *this,long value)

{
  atomic_long *paVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  random_device *__urng;
  mapped_type *this_00;
  result_type_conflict rVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>,_bool> pVar5;
  double priority;
  double local_68;
  double local_60;
  double smallest_priority;
  pair<double,_cppmetrics::WeightedSample> local_50;
  WeightedSample local_38;
  
  rescale_if_needed(this);
  std::mutex::lock(&this->m_mutex);
  iVar3 = (*this->m_clock->_vptr_Clock[1])();
  local_60 = exp((double)(CONCAT44(extraout_var,iVar3) - this->m_start) * this->m_alpha);
  __tls_init();
  __urng = (random_device *)__tls_get_addr(&PTR_0012bf10);
  __tls_init();
  rVar4 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)((long)&__urng[1].field_0 + 8),__urng);
  priority = local_60 / rVar4;
  LOCK();
  paVar1 = &this->m_count;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  if (this->m_size < lVar2 + 1U) {
    smallest_priority =
         *(double *)((this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_68 = priority;
    if (smallest_priority < priority) {
      WeightedSample::WeightedSample(&local_38,value,local_60);
      local_50.first = local_68;
      WeightedSample::WeightedSample(&local_50.second,&local_38);
      pVar5 = std::
              _Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
              ::_M_emplace_unique<std::pair<double,cppmetrics::WeightedSample>>
                        ((_Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                          *)&this->m_samples,&local_50);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::
        _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
        ::erase(&(this->m_samples)._M_t,&smallest_priority);
      }
    }
  }
  else {
    WeightedSample::WeightedSample((WeightedSample *)&local_50,value,local_60);
    this_00 = std::
              map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
              ::operator[](&this->m_samples,&priority);
    WeightedSample::operator=(this_00,(WeightedSample *)&local_50);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::update(long value)
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  auto now = m_clock->now_as_time_t();
  auto scale_factor = now - m_start;
  double item_weight = std::exp(m_alpha * scale_factor);
  double priority = item_weight / dist(rd);
  
  auto new_size = m_count.fetch_add(1) + 1;
  if (new_size <= m_size)
  {
    m_samples[priority] = WeightedSample{value, item_weight};
  }
  else
  {
    const auto& smallest_pair = *m_samples.begin();
    double smallest_priority = smallest_pair.first;
    if (smallest_priority < priority)
    {
      auto insert_result = m_samples.insert(std::make_pair(priority, WeightedSample{value, item_weight}));
      bool did_insert = insert_result.second;
      if (did_insert)
      {
        m_samples.erase(smallest_priority);
      }
    }
  }
}